

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_90e4::read_back_tester::operator()(read_back_tester *this,string *s_)

{
  size_t in_RCX;
  void *__buf;
  size_t __nbytes;
  size_t __nbytes_00;
  string *filename_;
  vector<char,_std::allocator<char>_> s2;
  string filename;
  vector<char,_std::allocator<char>_> s1;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138 [32];
  _Vector_base<char,_std::allocator<char>_> local_118;
  assert_equal_container local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Vector_base<char,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  assert_equal local_38;
  
  std::operator+(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,"/test.txt");
  just::file::write((file *)&local_b8,(int)s_,__buf,in_RCX);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,&local_139);
  std::__cxx11::string::string((string *)&local_38,local_58);
  local_38._assert_msg._line = 0x25;
  std::__cxx11::string::string((string *)&local_78,(string *)s_);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  just::file::read((int)&local_b8,&local_98,__nbytes);
  just::file::read((int)&local_118,&local_b8,__nbytes_00);
  just::file::read<std::__cxx11::string>(&local_d8,(file *)&local_b8,filename_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,&local_13a);
  std::__cxx11::string::string((string *)&local_100,local_138);
  local_100._assert_msg._line = 0x17;
  just::test::assert_equal_container::
  run<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
            (&local_100,(vector<char,_std::allocator<char>_> *)&local_98,
             (vector<char,_std::allocator<char>_> *)&local_118);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,&local_13a);
  std::__cxx11::string::string((string *)&local_100,local_138);
  local_100._assert_msg._line = 0x18;
  just::test::assert_equal_container::
  run<std::vector<char,std::allocator<char>>,std::__cxx11::string>
            (&local_100,(vector<char,_std::allocator<char>_> *)&local_118,&local_d8);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string(local_138);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_118);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_98);
  just::test::assert_equal::operator()(&local_38,&local_78,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void operator()(const std::string& s_) const
    {
      const std::string filename = _tmp.path() + "/test.txt";

      just::file::write(filename, s_);
      JUST_ASSERT_EQUAL(s_, load_file(filename));
    }